

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  _Base_ptr p_Var1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  string local_30;
  
  if (this->use_field_number_ == true) {
    SimpleItoa_abi_cxx11_(&local_30,(protobuf *)(ulong)*(uint *)(field + 0x38),(int)reflection);
    TextGenerator::Print(generator,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  else {
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this->default_field_value_printer_).ptr_;
    local_30._M_dataplus._M_p = (pointer)paVar3;
    p_Var5 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var4 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = &p_Var4->_M_header;
      do {
        if (*(FieldDescriptor **)(p_Var5 + 1) >= field) {
          p_Var1 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(FieldDescriptor **)(p_Var5 + 1) < field];
      } while (p_Var5 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var1 != p_Var4) {
        psVar2 = &local_30;
        if (*(FieldDescriptor **)(p_Var1 + 1) <= field) {
          psVar2 = (string *)&p_Var1[1]._M_parent;
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(psVar2->_M_dataplus)._M_p;
      }
    }
    (**(code **)(paVar3->_M_allocated_capacity + 0x60))(&local_30,paVar3,message,reflection);
    TextGenerator::Print(generator,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator& generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator.Print(SimpleItoa(field->number()));
    return;
  }

  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, field, default_field_value_printer_.get());
  generator.Print(printer->PrintFieldName(message, reflection, field));
}